

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinExport::WriteBinaryBone(AssbinExport *this,IOStream *container,aiBone *b)

{
  AssbinChunkWriter chunk;
  AssbinChunkWriter local_48;
  
  local_48.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0072fcb8;
  local_48.buffer = (uint8_t *)0x0;
  local_48.magic = 0x123a;
  local_48.cur_size = 0;
  local_48.cursor = 0;
  local_48.initial = 0x1000;
  local_48.container = container;
  Write<aiString>(&local_48.super_IOStream,&b->mName);
  Write<unsigned_int>(&local_48.super_IOStream,&b->mNumWeights);
  Write<aiMatrix4x4t<float>>(&local_48.super_IOStream,&b->mOffsetMatrix);
  if (this->shortened == true) {
    WriteBounds<aiVertexWeight>(&local_48.super_IOStream,b->mWeights,b->mNumWeights);
  }
  else {
    WriteArray<aiVertexWeight>(&local_48.super_IOStream,b->mWeights,b->mNumWeights);
  }
  AssbinChunkWriter::~AssbinChunkWriter(&local_48);
  return;
}

Assistant:

void WriteBinaryBone(IOStream * container, const aiBone* b)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIBONE );

        Write<aiString>(&chunk,b->mName);
        Write<unsigned int>(&chunk,b->mNumWeights);
        Write<aiMatrix4x4>(&chunk,b->mOffsetMatrix);

        // for the moment we write dumb min/max values for the bones, too.
        // maybe I'll add a better, hash-like solution later
        if (shortened) {
            WriteBounds(&chunk,b->mWeights,b->mNumWeights);
        } // else write as usual
        else WriteArray<aiVertexWeight>(&chunk,b->mWeights,b->mNumWeights);
    }